

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_logger.c
# Opt level: O0

FILE * sunOpenLogFile(char *fname,char *mode)

{
  int iVar1;
  char *in_RSI;
  char *in_RDI;
  FILE *fp;
  FILE *local_18;
  
  local_18 = (FILE *)0x0;
  if (in_RDI != (char *)0x0) {
    iVar1 = strcmp(in_RDI,"stdout");
    if (iVar1 == 0) {
      local_18 = _stdout;
    }
    else {
      iVar1 = strcmp(in_RDI,"stderr");
      if (iVar1 == 0) {
        local_18 = _stderr;
      }
      else {
        local_18 = fopen(in_RDI,in_RSI);
      }
    }
  }
  return (FILE *)local_18;
}

Assistant:

static FILE* sunOpenLogFile(const char* fname, const char* mode)
{
  FILE* fp = NULL;

  if (fname)
  {
    if (!strcmp(fname, "stdout")) { fp = stdout; }
    else if (!strcmp(fname, "stderr")) { fp = stderr; }
    else { fp = fopen(fname, mode); }
  }

  return fp;
}